

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O1

void golf_shader_uniform_set_vec2(golf_shader_uniform_t *uniform,char *name,vec2 v)

{
  int iVar1;
  golf_shader_uniform_member_t *pgVar2;
  long lVar3;
  golf_shader_uniform_member_t *__s1;
  
  lVar3 = (long)(uniform->members).length;
  if (lVar3 < 1) {
    pgVar2 = (golf_shader_uniform_member_t *)0x0;
  }
  else {
    __s1 = (uniform->members).data;
    pgVar2 = (golf_shader_uniform_member_t *)0x0;
    do {
      iVar1 = strcmp(__s1->name,name);
      if ((iVar1 == 0) && (__s1->size == 8)) {
        pgVar2 = __s1;
      }
      __s1 = __s1 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  if (pgVar2 == (golf_shader_uniform_member_t *)0x0) {
    golf_log_warning("Unable to find vec2 member: %s",name);
    return;
  }
  *(vec2 *)(uniform->data + pgVar2->offset) = v;
  return;
}

Assistant:

void golf_shader_uniform_set_vec2(golf_shader_uniform_t *uniform, const char *name, vec2 v) {
    golf_shader_uniform_member_t *member = NULL;
    for (int i = 0; i < uniform->members.length; i++) {
        if ((strcmp(uniform->members.data[i].name, name) == 0) && uniform->members.data[i].size == 8) {
            member = &uniform->members.data[i];
        }
    }
    if (!member) {
        golf_log_warning("Unable to find vec2 member: %s", name);
        return;
    }
    memcpy(uniform->data + member->offset, &v, 8);
}